

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O3

bool __thiscall
cmFindLibraryCommand::InitialPass
          (cmFindLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn,cmExecutionStatus *param_2)

{
  string *name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *__s;
  size_t sVar6;
  long lVar7;
  cmState *this_01;
  string library;
  string notfound;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).VariableDocumentation,0,
             (char *)(this->super_cmFindBase).VariableDocumentation._M_string_length,0x507208);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName,0,
             (char *)(this->super_cmFindBase).super_cmFindCommon.CMakePathName._M_string_length,
             0x513d04);
  iVar4 = (*(this->super_cmFindBase).super_cmFindCommon.super_cmCommand.super_cmObject.
            _vptr_cmObject[0xd])(this,argsIn);
  if (SUB41(iVar4,0) != false) {
    if ((this->super_cmFindBase).AlreadyInCache == true) {
      if ((this->super_cmFindBase).AlreadyInCacheWithoutMetaInfo == true) {
        cmMakefile::AddCacheDefinition
                  ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,
                   &(this->super_cmFindBase).VariableName,"",
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
      }
    }
    else {
      this_00 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      paVar1 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"CMAKE_INTERNAL_PLATFORM_ABI","");
      __s = cmMakefile::GetDefinition(this_00,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (__s != (char *)0x0) {
        local_70._M_dataplus._M_p = (pointer)paVar1;
        sVar6 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,__s + sVar6);
        lVar7 = std::__cxx11::string::find((char *)&local_70,0x507237,0);
        if (lVar7 != -1) {
          AddArchitecturePaths(this,"32");
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      this_01 = cmMakefile::GetState
                          ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"FIND_LIBRARY_USE_LIB64_PATHS","");
      bVar3 = cmState::GetGlobalPropertyAsBool(this_01,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        bVar3 = cmMakefile::PlatformIs64Bit
                          ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
        if (bVar3) {
          AddArchitecturePaths(this,"64");
        }
      }
      FindLibrary_abi_cxx11_(&local_70,this);
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      name = &(this->super_cmFindBase).VariableName;
      if (iVar5 == 0) {
        pcVar2 = (this->super_cmFindBase).VariableName._M_dataplus._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar2,
                   pcVar2 + (this->super_cmFindBase).VariableName._M_string_length);
        std::__cxx11::string::append((char *)local_50);
        cmMakefile::AddCacheDefinition
                  ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,name,
                   (char *)local_50[0],
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      else {
        cmMakefile::AddCacheDefinition
                  ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,name,
                   local_70._M_dataplus._M_p,
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return SUB41(iVar4,0);
}

Assistant:

bool cmFindLibraryCommand
::InitialPass(std::vector<std::string> const& argsIn, cmExecutionStatus &)
{
  this->VariableDocumentation = "Path to a library.";
  this->CMakePathName = "LIBRARY";
  if(!this->ParseArguments(argsIn))
    {
    return false;
    }
  if(this->AlreadyInCache)
    {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if(this->AlreadyInCacheWithoutMetaInfo)
      {
      this->Makefile->AddCacheDefinition(this->VariableName, "",
                                         this->VariableDocumentation.c_str(),
                                         cmState::FILEPATH);
      }
    return true;
    }

  if(const char* abi_name =
     this->Makefile->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI"))
    {
    std::string abi = abi_name;
    if(abi.find("ELF N32") != abi.npos)
      {
      // Convert lib to lib32.
      this->AddArchitecturePaths("32");
      }
    }

  if(this->Makefile->GetState()
         ->GetGlobalPropertyAsBool("FIND_LIBRARY_USE_LIB64_PATHS"))
    {
    // add special 64 bit paths if this is a 64 bit compile.
    if(this->Makefile->PlatformIs64Bit())
      {
      this->AddArchitecturePaths("64");
      }
    }

  std::string library = this->FindLibrary();
  if(library != "")
    {
    // Save the value in the cache
    this->Makefile->AddCacheDefinition(this->VariableName,
                                       library.c_str(),
                                       this->VariableDocumentation.c_str(),
                                       cmState::FILEPATH);
    return true;
    }
  std::string notfound = this->VariableName + "-NOTFOUND";
  this->Makefile->AddCacheDefinition(this->VariableName,
                                     notfound.c_str(),
                                     this->VariableDocumentation.c_str(),
                                     cmState::FILEPATH);
  return true;
}